

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

Code * __thiscall r_exec::PGMOverlay::dereference_in_ptr(PGMOverlay *this,Atom *a)

{
  Atom *pAVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  Code *pCVar6;
  undefined4 extraout_var;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 local_34;
  Code *local_30;
  Code *parent;
  Atom ptr;
  Atom *pAStack_20;
  Atom *a_local;
  PGMOverlay *this_local;
  
  pAStack_20 = a;
  cVar2 = r_code::Atom::getDescriptor();
  if (cVar2 == -0x78) {
    bVar3 = r_code::Atom::asInputIndex();
    this_local = (PGMOverlay *)getInputObject(this,(ushort)bVar3);
  }
  else if (cVar2 == -0x74) {
    pAVar1 = (this->super_InputLessPGMOverlay).super_Overlay.code;
    bVar3 = r_code::Atom::asRelativeIndex();
    uVar7 = (ulong)bVar3;
    local_34 = *(undefined4 *)(pAVar1 + uVar7 * 4);
    parent._4_4_ = local_34;
    pCVar6 = dereference_in_ptr(this,(Atom *)&local_34);
    r_code::Atom::~Atom((Atom *)&local_34);
    local_30 = pCVar6;
    uVar4 = r_code::Atom::asIndex();
    uVar8 = CONCAT62((int6)(uVar7 >> 0x10),uVar4);
    (*(pCVar6->super__Object)._vptr__Object[4])(pCVar6,(ulong)uVar4,extraout_RDX,uVar8);
    uVar4 = r_code::Atom::asIndex();
    iVar5 = (*(pCVar6->super__Object)._vptr__Object[9])
                      (pCVar6,(ulong)uVar4,extraout_RDX_00,
                       CONCAT62((int6)((ulong)uVar8 >> 0x10),uVar4));
    this_local = (PGMOverlay *)CONCAT44(extraout_var,iVar5);
    r_code::Atom::~Atom((Atom *)((long)&parent + 4));
  }
  else {
    this_local = (PGMOverlay *)0x0;
  }
  return (Code *)this_local;
}

Assistant:

Code *PGMOverlay::dereference_in_ptr(Atom a)
{
    switch (a.getDescriptor()) {
    case Atom::IN_OBJ_PTR:
        return getInputObject(a.asInputIndex());

    case Atom::D_IN_OBJ_PTR: {
        Atom ptr = code[a.asRelativeIndex()]; // must be either an IN_OBJ_PTR or a D_IN_OBJ_PTR.
        Code *parent = dereference_in_ptr(ptr);
        return parent->get_reference(parent->code(ptr.asIndex()).asIndex());
    }

    default: // shall never happen.
        return nullptr;
    }
}